

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::SequentialStmtBlock::add_condition
          (SequentialStmtBlock *this,
          pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *condition)

{
  uint64_t uVar1;
  bool bVar2;
  element_type *var;
  EventControl local_60;
  __normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
  local_40;
  EventControl *local_38;
  EventControl *local_30;
  __normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
  local_28;
  __normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
  local_20;
  __normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
  pos;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *condition_local;
  SequentialStmtBlock *this_local;
  
  pos._M_current = (EventControl *)condition;
  local_28._M_current =
       (EventControl *)
       std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::begin
                 (&this->conditions_);
  local_30 = (EventControl *)
             std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end
                       (&this->conditions_);
  local_38 = pos._M_current;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<kratos::EventControl*,std::vector<kratos::EventControl,std::allocator<kratos::EventControl>>>,kratos::SequentialStmtBlock::add_condition(std::pair<kratos::EventEdgeType,std::shared_ptr<kratos::Var>>const&)::__0>
                       (local_28,(__normal_iterator<kratos::EventControl_*,_std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>_>
                                  )local_30,pos._M_current);
  local_40._M_current =
       (EventControl *)
       std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::end
                 (&this->conditions_);
  bVar2 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (!bVar2) {
    uVar1 = (pos._M_current)->delay;
    var = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                    ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &(pos._M_current)->var);
    EventControl::EventControl(&local_60,(EventEdgeType)uVar1,var);
    std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::
    emplace_back<kratos::EventControl>(&this->conditions_,&local_60);
  }
  return;
}

Assistant:

void SequentialStmtBlock::add_condition(
    const std::pair<EventEdgeType, std::shared_ptr<Var>> &condition) {
    // notice that the condition variable cannot be used as a condition
    // for now we only allow Port (clk and reset) type to use as conditions
    // make sure no duplicate
    auto pos = std::find_if(
        conditions_.begin(), conditions_.end(), [&condition](const EventControl &event) -> bool {
            return event.var == condition.second.get() && event.edge == condition.first;
        });
    if (pos != conditions_.end()) return;

    conditions_.emplace_back(EventControl(condition.first, *condition.second));
}